

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_skein.c
# Opt level: O0

int Skein_512_Final(Skein_512_Ctxt_t *ctx,u08b_t *hashVal)

{
  long in_RSI;
  long *in_RDI;
  u64b_t X [8];
  size_t byteCnt;
  size_t n;
  size_t i;
  size_t in_stack_00000078;
  size_t in_stack_00000080;
  u08b_t *in_stack_00000088;
  Skein_512_Ctxt_t *in_stack_00000090;
  undefined1 auStack_68 [64];
  ulong local_28;
  size_t local_20;
  long local_18;
  long local_10;
  long *local_8;
  
  in_RDI[3] = in_RDI[3] | 0x8000000000000000;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((ulong)in_RDI[1] < 0x40) {
    memset((void *)((long)in_RDI + in_RDI[1] + 0x60),0,0x40 - in_RDI[1]);
  }
  Skein_512_Process_Block(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  local_28 = *local_8 + 7U >> 3;
  memset(local_8 + 0xc,0,0x40);
  memcpy(auStack_68,local_8 + 4,0x40);
  for (local_18 = 0; (ulong)(local_18 << 6) < local_28; local_18 = local_18 + 1) {
    local_8[0xc] = local_18;
    local_8[2] = 0;
    local_8[3] = -0x100000000000000;
    local_8[1] = 0;
    Skein_512_Process_Block(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078)
    ;
    local_20 = local_28 + local_18 * -0x40;
    if (0x3f < local_20) {
      local_20 = 0x40;
    }
    memcpy((void *)(local_10 + local_18 * 0x40),local_8 + 4,local_20);
    memcpy(local_8 + 4,auStack_68,0x40);
  }
  return 0;
}

Assistant:

static int Skein_512_Final(Skein_512_Ctxt_t *ctx, u08b_t *hashVal)
    {
    size_t i,n,byteCnt;
    u64b_t X[SKEIN_512_STATE_WORDS];
    Skein_Assert(ctx->h.bCnt <= SKEIN_512_BLOCK_BYTES,SKEIN_FAIL);    /* catch uninitialized context */

    ctx->h.T[1] |= SKEIN_T1_FLAG_FINAL;                 /* tag as the final block */
    if (ctx->h.bCnt < SKEIN_512_BLOCK_BYTES)            /* zero pad b[] if necessary */
        memset(&ctx->b[ctx->h.bCnt],0,SKEIN_512_BLOCK_BYTES - ctx->h.bCnt);

    Skein_512_Process_Block(ctx,ctx->b,1,ctx->h.bCnt);  /* process the final block */
    
    /* now output the result */
    byteCnt = (ctx->h.hashBitLen + 7) >> 3;             /* total number of output bytes */

    /* run Threefish in "counter mode" to generate output */
    memset(ctx->b,0,sizeof(ctx->b));  /* zero out b[], so it can hold the counter */
    memcpy(X,ctx->X,sizeof(X));       /* keep a local copy of counter mode "key" */
    for (i=0;i*SKEIN_512_BLOCK_BYTES < byteCnt;i++)
        {
        ((u64b_t *)ctx->b)[0]= Skein_Swap64((u64b_t) i); /* build the counter block */
        Skein_Start_New_Type(ctx,OUT_FINAL);
        Skein_512_Process_Block(ctx,ctx->b,1,sizeof(u64b_t)); /* run "counter mode" */
        n = byteCnt - i*SKEIN_512_BLOCK_BYTES;   /* number of output bytes left to go */
        if (n >= SKEIN_512_BLOCK_BYTES)
            n  = SKEIN_512_BLOCK_BYTES;
        Skein_Put64_LSB_First(hashVal+i*SKEIN_512_BLOCK_BYTES,ctx->X,n);   /* "output" the ctr mode bytes */
        Skein_Show_Final(512,&ctx->h,n,hashVal+i*SKEIN_512_BLOCK_BYTES);
        memcpy(ctx->X,X,sizeof(X));   /* restore the counter mode key for next time */
        }
    return SKEIN_SUCCESS;
    }